

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O0

ai_real Assimp::ComputePositionEpsilon(aiMesh **pMeshes,size_t num)

{
  float fVar1;
  aiVector3t<float> aVar2;
  aiVector3t<float> local_c0;
  aiVector3t<float> local_ac;
  aiVector3t<float> local_a0;
  undefined8 local_8c;
  float local_84;
  aiVector3t<float> local_80;
  float local_70;
  float fStack_6c;
  float local_68;
  aiMesh *local_60;
  aiMesh *pMesh;
  size_t a;
  aiVector3D ma;
  aiVector3D mi;
  aiVector3D maxVec;
  aiVector3D minVec;
  ai_real epsilon;
  size_t num_local;
  aiMesh **pMeshes_local;
  
  if (pMeshes != (aiMesh **)0x0) {
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&maxVec.y);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&mi.y);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&ma.y);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&a + 4));
    MinMaxChooser<aiVector3t<float>_>::operator()
              ((MinMaxChooser<aiVector3t<float>_> *)((long)&a + 3),(aiVector3t<float> *)&maxVec.y,
               (aiVector3t<float> *)&mi.y);
    for (pMesh = (aiMesh *)0x0; pMesh < num; pMesh = (aiMesh *)((long)&pMesh->mPrimitiveTypes + 1))
    {
      local_60 = pMeshes[(long)pMesh];
      ArrayBounds<aiVector3t<float>>
                (local_60->mVertices,local_60->mNumVertices,(aiVector3t<float> *)&ma.y,
                 (aiVector3t<float> *)((long)&a + 4));
      aVar2 = std::min<float>((aiVector3t<float> *)&maxVec.y,(aiVector3t<float> *)&ma.y);
      local_80.z = aVar2.z;
      local_68 = local_80.z;
      local_80._0_8_ = aVar2._0_8_;
      local_70 = local_80.x;
      fStack_6c = local_80.y;
      maxVec.y = local_80.x;
      maxVec.z = local_80.y;
      local_80 = aVar2;
      aVar2 = std::max<float>((aiVector3t<float> *)&mi.y,(aiVector3t<float> *)((long)&a + 4));
      local_a0._0_8_ = aVar2._0_8_;
      local_8c._0_4_ = local_a0.x;
      local_8c._4_4_ = local_a0.y;
      local_a0.z = aVar2.z;
      local_84 = local_a0.z;
      mi.y = local_a0.x;
      mi.z = local_a0.y;
      maxVec.x = local_a0.z;
      local_a0 = aVar2;
    }
    aVar2 = ::operator-((aiVector3t<float> *)&mi.y,(aiVector3t<float> *)&maxVec.y);
    local_c0._0_8_ = aVar2._0_8_;
    local_ac.x = local_c0.x;
    local_ac.y = local_c0.y;
    local_c0.z = aVar2.z;
    local_ac.z = local_c0.z;
    fVar1 = aiVector3t<float>::Length(&local_ac);
    return fVar1 * 0.0001;
  }
  __assert_fail("__null != pMeshes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ProcessHelper.cpp"
                ,0xa0,"ai_real Assimp::ComputePositionEpsilon(const aiMesh *const *, size_t)");
}

Assistant:

ai_real ComputePositionEpsilon(const aiMesh* const* pMeshes, size_t num)
{
    ai_assert( NULL != pMeshes );

    const ai_real epsilon = ai_real( 1e-4 );

    // calculate the position bounds so we have a reliable epsilon to check position differences against
    aiVector3D minVec, maxVec, mi, ma;
    MinMaxChooser<aiVector3D>()(minVec,maxVec);

    for (size_t a = 0; a < num; ++a) {
        const aiMesh* pMesh = pMeshes[a];
        ArrayBounds(pMesh->mVertices,pMesh->mNumVertices,mi,ma);

        minVec = std::min(minVec,mi);
        maxVec = std::max(maxVec,ma);
    }
    return (maxVec - minVec).Length() * epsilon;
}